

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O3

void __thiscall
bioparser::test::BioparserFastaTest_ParseWholeWithoutTrimming_Test::TestBody
          (BioparserFastaTest_ParseWholeWithoutTrimming_Test *this)

{
  Parser<biosoup::Sequence> *pPVar1;
  string local_58;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"sample.fasta","");
  BioparserFastaTest::Setup(&this->super_BioparserFastaTest,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pPVar1 = (this->super_BioparserFastaTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&local_38,pPVar1,0xffffffffffffffff,0);
  local_58.field_2._M_allocated_capacity =
       (size_type)
       (this->super_BioparserFastaTest).s.
       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_BioparserFastaTest).s.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.
       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._M_dataplus._M_p =
       (pointer)(this->super_BioparserFastaTest).s.
                super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_string_length =
       (size_type)
       (this->super_BioparserFastaTest).s.
       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_BioparserFastaTest).s.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_38.
       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_BioparserFastaTest).s.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_38.
       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
             *)&local_58);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector(&local_38);
  BioparserFastaTest::Check(&this->super_BioparserFastaTest,false);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, ParseWholeWithoutTrimming) {
  Setup("sample.fasta");
  s = p->Parse(-1, false);
  Check(false);
}